

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O2

void lock(int n,int *a)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (-1 < n) {
    *a = 1;
    for (uVar5 = 1; uVar5 != n + 1; uVar5 = uVar5 + 1) {
      a[uVar5] = 0;
      iVar2 = 0;
      piVar3 = a;
      uVar4 = uVar5;
      while (uVar4 != 0) {
        iVar1 = i4_choose((int)uVar5,(int)uVar4);
        iVar2 = iVar2 + iVar1 * *piVar3;
        a[uVar5] = iVar2;
        piVar3 = piVar3 + 1;
        uVar4 = uVar4 - 1;
      }
    }
  }
  return;
}

Assistant:

void lock ( int n, int a[] )

//****************************************************************************80
//
//  Purpose:
//
//    LOCK returns the number of codes for a lock with N buttons.
//
//  Discussion:
//
//    A button lock has N numbered buttons.  To open the lock, groups
//    of buttons must be pressed in the correct order.  Each button
//    may be pushed no more than once.  Thus, a code for the lock is
//    an ordered list of the groups of buttons to be pushed.
//
//    For this discussion, we will assume that EVERY button is pushed
//    at some time, as part of the code.  To count the total number
//    of codes, including those which don't use all the buttons, then
//    the number is 2 * A(N), or 2 * A(N) - 1 if we don't consider the
//    empty code to be valid.
//
//  Examples:
//
//    If there are 3 buttons, then there are 13 possible "full button" codes:
//
//      (123)
//      (12) (3)
//      (13) (2)
//      (23) (1)
//      (1) (23)
//      (2) (13)
//      (3) (12)
//      (1) (2) (3)
//      (1) (3) (2)
//      (2) (1) (3)
//      (2) (3) (1)
//      (3) (1) (2)
//      (3) (2) (1)
//
//
//    and, if we don't need to push all the buttons, every "full button" code above
//    yields a distinct "partial button" code by dropping the last set of buttons:
//
//      ()
//      (12)
//      (13)
//      (23)
//      (1)
//      (2)
//      (3)
//      (1) (2)
//      (1) (3)
//      (2) (1)
//      (2) (3)
//      (3) (1)
//      (3) (2)
//
//  First values:
//
//     N         A(N)
//     0           1
//     1           1
//     2           3
//     3          13
//     4          75
//     5         541
//     6        4683
//     7       47293
//     8      545835
//     9     7087261
//    10   102247563
//
//  Recursion:
//
//    A(I) = sum ( 0 <= J < I ) Binomial ( I, N-J ) * A(J)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    12 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Daniel Velleman, Gregory Call,
//    Permutations and Combination Locks,
//    Mathematics Magazine,
//    Volume 68, Number 4, October 1995, pages 243-253.
//
//  Parameters:
//
//    Input, int N, the maximum number of lock buttons.
//
//    Output, int A[N+1], the number of lock codes with 0 to N buttons.
//
{
  int i;
  int j;

  if ( n < 0 )
  {
    return;
  }

  a[0] = 1;

  for ( i = 1; i <= n; i++ )
  {
    a[i] = 0;
    for ( j = 0; j <= i-1; j++ )
    {
      a[i] = a[i] + i4_choose ( i, i-j ) * a[j];
    }
  }

  return;
}